

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,Encoding encoding)

{
  codecvt *this_00;
  locale lStack_48;
  locale local_40;
  locale local_38;
  
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_006383c8;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_006383f0;
  if (encoding != None) {
    std::locale::locale(&lStack_48,(locale *)&this->field_0x210);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>(&local_40,&lStack_48,this_00);
    std::ios::imbue(&local_38);
    std::locale::~locale(&local_38);
    std::locale::~locale(&local_40);
    std::locale::~locale(&lStack_48);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(Encoding encoding)
  : cmGeneratedFileStreamBase()
  , Stream()
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}